

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

bool __thiscall
cppjieba::DictTrie::MakeNodeInfo
          (DictTrie *this,DictUnit *node_info,string *word,double weight,string *tag)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RCX;
  string *in_RDX;
  long in_RSI;
  undefined8 in_XMM0_Qa;
  Unicode *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  Logger *this_00;
  Logger *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  Logger *in_stack_fffffffffffffed0;
  
  bVar1 = DecodeRunesInString(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (bVar1) {
    *(undefined8 *)(in_RSI + 0x58) = in_XMM0_Qa;
    std::__cxx11::string::operator=((string *)(in_RSI + 0x60),in_RCX);
  }
  else {
    this_00 = (Logger *)&stack0xfffffffffffffe50;
    limonp::Logger::Logger
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    poVar2 = limonp::Logger::Stream(this_00);
    poVar2 = std::operator<<(poVar2,"Decode ");
    poVar2 = std::operator<<(poVar2,in_RDX);
    std::operator<<(poVar2," failed.");
    limonp::Logger::~Logger(in_stack_fffffffffffffe60);
  }
  return bVar1;
}

Assistant:

bool MakeNodeInfo(DictUnit& node_info,
        const string& word, 
        double weight, 
        const string& tag) {
    if (!DecodeRunesInString(word, node_info.word)) {
      XLOG(ERROR) << "Decode " << word << " failed.";
      return false;
    }
    node_info.weight = weight;
    node_info.tag = tag;
    return true;
  }